

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

int __thiscall Imf_3_2::DeepTiledOutputFile::numYTiles(DeepTiledOutputFile *this,int ly)

{
  ostream *poVar1;
  char *pcVar2;
  LogicExc *this_00;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  if ((-1 < ly) && (ly < this->_data->numYLevels)) {
    return this->_data->numYTiles[(uint)ly];
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar1 = std::operator<<(local_188,"Error calling numXTiles() on image file \"");
  pcVar2 = OStream::fileName(this->_data->_streamData->os);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\" (Argument is not in valid range).");
  this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::LogicExc::LogicExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_2::LogicExc::typeinfo,Iex_3_2::LogicExc::~LogicExc);
}

Assistant:

int
DeepTiledOutputFile::numYTiles (int ly) const
{
    if (ly < 0 || ly >= _data->numYLevels)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Error calling numXTiles() on image "
            "file \""
                << _data->_streamData->os->fileName ()
                << "\" "
                   "(Argument is not in valid range).");

    return _data->numYTiles[ly];
}